

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

void __thiscall AtomicHash::xorWith(AtomicHash *this,uint64_t *update)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  long in_RSI;
  long in_RDI;
  bool bVar4;
  int i;
  ulong uStack_c0;
  int local_3c;
  
  for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
    puVar1 = (ulong *)(in_RDI + (long)local_3c * 8);
    uVar2 = *(ulong *)(in_RSI + (long)local_3c * 8);
    uStack_c0 = *puVar1;
    do {
      LOCK();
      uVar3 = *puVar1;
      bVar4 = uStack_c0 == uVar3;
      if (bVar4) {
        *puVar1 = uStack_c0 ^ uVar2;
        uVar3 = uStack_c0;
      }
      UNLOCK();
      uStack_c0 = uVar3;
    } while (!bVar4);
  }
  return;
}

Assistant:

void xorWith(uint64_t update[4]) {
		for (int i = 0; i < 4; ++i)
			hash[i].fetch_xor(update[i]);
	}